

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nearest_neighbor.cc
# Opt level: O0

void features::anon_unknown_1::short_inner_prod<unsigned_short>
               (unsigned_short *query,Result *result,unsigned_short *elements,int num_elements,
               int dimensions)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  int inner_product;
  unsigned_short *tmp;
  __m128i reg_subject;
  __m128i reg_query;
  int local_dc;
  undefined8 uStack_d8;
  int i;
  __m128i reg_result;
  unsigned_short *local_c0;
  __m128i *query_ptr;
  unsigned_short *puStack_b0;
  int descr_iter;
  __m128i *descr_ptr;
  int dim_8;
  int dimensions_local;
  int num_elements_local;
  unsigned_short *elements_local;
  Result *result_local;
  unsigned_short *query_local;
  ushort local_58;
  ushort uStack_56;
  ushort uStack_54;
  ushort uStack_52;
  ushort uStack_50;
  ushort uStack_4e;
  ushort uStack_4c;
  ushort uStack_4a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short sStack_30;
  short sStack_2e;
  short sStack_2c;
  short sStack_2a;
  
  puStack_b0 = elements;
  for (query_ptr._4_4_ = 0; query_ptr._4_4_ < num_elements; query_ptr._4_4_ = query_ptr._4_4_ + 1) {
    uStack_d8 = 0;
    reg_result[0] = 0;
    local_dc = 0;
    local_c0 = query;
    while( true ) {
      local_58 = (ushort)uStack_d8;
      uStack_56 = (ushort)((ulong)uStack_d8 >> 0x10);
      uStack_54 = (ushort)((ulong)uStack_d8 >> 0x20);
      uStack_52 = (ushort)((ulong)uStack_d8 >> 0x30);
      uStack_50 = (ushort)reg_result[0];
      uStack_4e = (ushort)((ulong)reg_result[0] >> 0x10);
      uStack_4c = (ushort)((ulong)reg_result[0] >> 0x20);
      uStack_4a = (ushort)((ulong)reg_result[0] >> 0x30);
      if (dimensions / 8 <= local_dc) break;
      uVar1 = *(undefined8 *)local_c0;
      uVar2 = *(undefined8 *)(local_c0 + 4);
      uVar3 = *(undefined8 *)puStack_b0;
      uVar4 = *(undefined8 *)(puStack_b0 + 4);
      local_38 = (short)uVar1;
      sStack_36 = (short)((ulong)uVar1 >> 0x10);
      sStack_34 = (short)((ulong)uVar1 >> 0x20);
      sStack_32 = (short)((ulong)uVar1 >> 0x30);
      sStack_30 = (short)uVar2;
      sStack_2e = (short)((ulong)uVar2 >> 0x10);
      sStack_2c = (short)((ulong)uVar2 >> 0x20);
      sStack_2a = (short)((ulong)uVar2 >> 0x30);
      local_48 = (short)uVar3;
      sStack_46 = (short)((ulong)uVar3 >> 0x10);
      sStack_44 = (short)((ulong)uVar3 >> 0x20);
      sStack_42 = (short)((ulong)uVar3 >> 0x30);
      sStack_40 = (short)uVar4;
      sStack_3e = (short)((ulong)uVar4 >> 0x10);
      sStack_3c = (short)((ulong)uVar4 >> 0x20);
      sStack_3a = (short)((ulong)uVar4 >> 0x30);
      uStack_d8 = CONCAT26(uStack_52 + sStack_32 * sStack_42,
                           CONCAT24(uStack_54 + sStack_34 * sStack_44,
                                    CONCAT22(uStack_56 + sStack_36 * sStack_46,
                                             local_58 + local_38 * local_48)));
      reg_result[0] =
           CONCAT26(uStack_4a + sStack_2a * sStack_3a,
                    CONCAT24(uStack_4c + sStack_2c * sStack_3c,
                             CONCAT22(uStack_4e + sStack_2e * sStack_3e,
                                      uStack_50 + sStack_30 * sStack_40)));
      local_dc = local_dc + 1;
      local_c0 = local_c0 + 8;
      puStack_b0 = puStack_b0 + 8;
    }
    uVar5 = (uint)local_58 + (uint)uStack_56 + (uint)uStack_54 + (uint)uStack_52 + (uint)uStack_50 +
            (uint)uStack_4e + (uint)uStack_4c + (uint)uStack_4a;
    if (result->dist_2nd_best <= uVar5) {
      if (uVar5 < result->dist_1st_best) {
        result->index_2nd_best = query_ptr._4_4_;
        result->dist_2nd_best = (unsigned_short)uVar5;
      }
      else {
        result->index_2nd_best = result->index_1st_best;
        result->dist_2nd_best = result->dist_1st_best;
        result->index_1st_best = query_ptr._4_4_;
        result->dist_1st_best = (unsigned_short)uVar5;
      }
    }
  }
  return;
}

Assistant:

void
    short_inner_prod (T const* query,
        typename NearestNeighbor<T>::Result* result,
        T const* elements, int num_elements, int dimensions)
    {
#if ENABLE_SSE2_NN_SEARCH && defined(__SSE2__)
        /* Using a constant number reduces computation time by about 1/3. */
        int const dim_8 = dimensions / 8;
        __m128i const* descr_ptr = reinterpret_cast<__m128i const*>(elements);
        for (int descr_iter = 0; descr_iter < num_elements; ++descr_iter)
        {
            /* Compute dot product between query and candidate. */
            __m128i const* query_ptr = reinterpret_cast<__m128i const*>(query);
            __m128i reg_result = _mm_set1_epi16(0);
            for (int i = 0; i < dim_8; ++i, ++query_ptr, ++descr_ptr)
            {
                __m128i reg_query = _mm_load_si128(query_ptr);
                __m128i reg_subject = _mm_load_si128(descr_ptr);
                reg_result = _mm_add_epi16(reg_result,
                    _mm_mullo_epi16(reg_query, reg_subject));
            }
            T const* tmp = reinterpret_cast<T const*>(&reg_result);
            int inner_product = tmp[0] + tmp[1] + tmp[2] + tmp[3]
                + tmp[4] + tmp[5] + tmp[6] + tmp[7];

            /* Check if new largest inner product has been found. */
            if (inner_product >= result->dist_2nd_best)
            {
                if (inner_product >= result->dist_1st_best)
                {
                    result->index_2nd_best = result->index_1st_best;
                    result->dist_2nd_best = result->dist_1st_best;
                    result->index_1st_best = descr_iter;
                    result->dist_1st_best = inner_product;
                }
                else
                {
                    result->index_2nd_best = descr_iter;
                    result->dist_2nd_best = inner_product;
                }
            }
        }
#else
        T const* descr_ptr = elements;
        for (int i = 0; i < num_elements; ++i)
        {
            int inner_product = 0;
            for (int i = 0; i < dimensions; ++i, ++descr_ptr)
                inner_product += query[i] * *descr_ptr;

            /* Check if new largest inner product has been found. */
            if (inner_product >= result->dist_2nd_best)
            {
                if (inner_product >= result->dist_1st_best)
                {
                    result->index_2nd_best = result->index_1st_best;
                    result->dist_2nd_best = result->dist_1st_best;
                    result->index_1st_best = i;
                    result->dist_1st_best = inner_product;
                }
                else
                {
                    result->index_2nd_best = i;
                    result->dist_2nd_best = inner_product;
                }
            }
        }
#endif
    }